

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::writeConsole(Private *this,char *data,usize len)

{
  usize len_local;
  char *data_local;
  Private *this_local;
  
  Buffer::append(&this->bufferedOutput,(byte *)data,len);
  return;
}

Assistant:

void writeConsole(const char* data, usize len)
  {
#ifdef _MSC_VER
    DWORD written;
    VERIFY(WriteConsole(hOriginalStdOut, data, (DWORD)len, &written, NULL));
    ASSERT(written == (DWORD)len);
#else
    bufferedOutput.append((const byte*)data, len);
#endif
  }